

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O0

int max_passive_dmg(monst *mdef,monst *magr)

{
  uchar uVar1;
  uint local_28;
  int iStack_24;
  uchar adtyp;
  int dmg;
  int i;
  monst *magr_local;
  monst *mdef_local;
  
  iStack_24 = 0;
  while( true ) {
    if (5 < iStack_24) {
      return 0;
    }
    if ((mdef->data->mattk[iStack_24].aatyp == '\0') ||
       (mdef->data->mattk[iStack_24].aatyp == '\x0e')) break;
    iStack_24 = iStack_24 + 1;
  }
  uVar1 = mdef->data->mattk[iStack_24].adtyp;
  if (((((uVar1 == '\b') && ((magr->mintrinsics & 0x40) == 0)) ||
       ((uVar1 == '\x03' && ((magr->mintrinsics & 2) == 0)))) ||
      ((uVar1 == '\x02' && ((magr->mintrinsics & 1) == 0)))) ||
     (((uVar1 == '\x06' && ((magr->mintrinsics & 0x10) == 0)) || (uVar1 == '\0')))) {
    local_28 = (uint)mdef->data->mattk[iStack_24].damn;
    if (local_28 == 0) {
      local_28 = (int)mdef->data->mlevel + 1;
    }
    local_28 = mdef->data->mattk[iStack_24].damd * local_28;
  }
  else {
    local_28 = 0;
  }
  return local_28;
}

Assistant:

int max_passive_dmg(struct monst *mdef, struct monst *magr)
{
    int	i, dmg = 0;
    uchar adtyp;

    for (i = 0; i < NATTK; i++)
	if (mdef->data->mattk[i].aatyp == AT_NONE ||
		mdef->data->mattk[i].aatyp == AT_BOOM) {
	    adtyp = mdef->data->mattk[i].adtyp;
	    if ((adtyp == AD_ACID && !resists_acid(magr)) ||
		    (adtyp == AD_COLD && !resists_cold(magr)) ||
		    (adtyp == AD_FIRE && !resists_fire(magr)) ||
		    (adtyp == AD_ELEC && !resists_elec(magr)) ||
		    adtyp == AD_PHYS) {
		dmg = mdef->data->mattk[i].damn;
		if (!dmg) dmg = mdef->data->mlevel+1;
		dmg *= mdef->data->mattk[i].damd;
	    } else dmg = 0;

	    return dmg;
	}
    return 0;
}